

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O2

Fraig_NodeVec_t * Fraig_ManGetSimInfo(Fraig_Man_t *p)

{
  Fraig_NodeVec_t *pFVar1;
  Fraig_Node_t *pFVar2;
  Fraig_Node_t *pFVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fraig_NodeVec_t *pFVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  iVar6 = Fraig_ManReadPatternNumRandom(p);
  iVar7 = Fraig_ManReadPatternNumDynamic(p);
  iVar4 = (int)((long)iVar7 / 0x20);
  iVar5 = (int)((long)iVar6 / 0x20);
  uVar12 = 0;
  pFVar8 = Fraig_UtilInfoAlloc(p->vNodes->nSize,iVar4 + iVar5,0);
  pFVar1 = p->vNodes;
  uVar9 = 0;
  if (0 < iVar5) {
    uVar9 = (long)iVar6 / 0x20 & 0xffffffff;
  }
  uVar10 = (long)iVar7 / 0x20 & 0xffffffff;
  if (iVar4 < 1) {
    uVar10 = uVar12;
  }
  while( true ) {
    if ((long)pFVar1->nSize <= (long)uVar12) {
      return pFVar8;
    }
    pFVar2 = pFVar1->pArray[uVar12];
    if (uVar12 != (uint)pFVar2->Num) break;
    pFVar3 = pFVar8->pArray[uVar12];
    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      (&pFVar3->Num)[uVar11] = pFVar2->puSimR[uVar11];
    }
    for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      (&pFVar3->Num)[(long)iVar5 + uVar11] = pFVar2->puSimD[uVar11];
    }
    uVar12 = uVar12 + 1;
  }
  __assert_fail("i == pNode->Num",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigMan.c"
                ,0x1b1,"Fraig_NodeVec_t *Fraig_ManGetSimInfo(Fraig_Man_t *)");
}

Assistant:

Fraig_NodeVec_t * Fraig_ManGetSimInfo( Fraig_Man_t * p )
{
    Fraig_NodeVec_t * vInfo;
    Fraig_Node_t * pNode;
    unsigned * pUnsigned;
    int nRandom, nDynamic;
    int i, k, nWords;

    nRandom  = Fraig_ManReadPatternNumRandom( p );
    nDynamic = Fraig_ManReadPatternNumDynamic( p );
    nWords = nRandom / 32 + nDynamic / 32;

    vInfo = Fraig_UtilInfoAlloc( p->vNodes->nSize, nWords, 0 );
    for ( i = 0; i < p->vNodes->nSize; i++ )
    {
        pNode = p->vNodes->pArray[i];
        assert( i == pNode->Num );
        pUnsigned = (unsigned *)vInfo->pArray[i];
        for ( k = 0; k < nRandom / 32; k++ )
            pUnsigned[k] = pNode->puSimR[k];
        for ( k = 0; k < nDynamic / 32; k++ )
            pUnsigned[nRandom / 32 + k] = pNode->puSimD[k];
    }
    return vInfo;
}